

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attributes_encoder.h
# Opt level: O2

void __thiscall
draco::AttributesEncoder::SetAttributeIds
          (AttributesEncoder *this,vector<int,_std::allocator<int>_> *point_attribute_ids)

{
  pointer piVar1;
  int32_t *piVar2;
  int32_t *piVar3;
  
  piVar1 = (this->point_attribute_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->point_attribute_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar1) {
    (this->point_attribute_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar1;
  }
  piVar1 = (this->point_attribute_to_local_id_map_).super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->point_attribute_to_local_id_map_).super__Vector_base<int,_std::allocator<int>_>._M_impl
      .super__Vector_impl_data._M_finish != piVar1) {
    (this->point_attribute_to_local_id_map_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar1;
  }
  piVar2 = (point_attribute_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (piVar3 = (point_attribute_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start; piVar3 != piVar2; piVar3 = piVar3 + 1) {
    AddAttributeId(this,*piVar3);
  }
  return;
}

Assistant:

void SetAttributeIds(const std::vector<int32_t> &point_attribute_ids) {
    point_attribute_ids_.clear();
    point_attribute_to_local_id_map_.clear();
    for (int32_t att_id : point_attribute_ids) {
      AddAttributeId(att_id);
    }
  }